

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closefd.c
# Opt level: O1

void nn_closefd(int fd)

{
  int iVar1;
  
  if ((-1 < fd) && (iVar1 = close(fd), iVar1 != 0)) {
    nn_closefd_cold_1();
  }
  return;
}

Assistant:

void nn_closefd (int fd)
{
    int rc;
    if (nn_slow (fd < 0)) {
        return;
    }
    rc = close (fd);
    if (nn_fast (rc == 0))
        return;
    errno_assert (errno == EINTR || errno == ETIMEDOUT ||
        errno == EWOULDBLOCK || errno == EINPROGRESS || errno == ECONNRESET);
}